

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O2

natwm_error button_handle_motion(natwm_state *state,uint16_t mouse_mask,int16_t x,int16_t y)

{
  button_state *pbVar1;
  client *client;
  natwm_error nVar2;
  
  pbVar1 = state->button_state;
  client = pbVar1->grabbed_client;
  if (client == (client *)0x0) {
    internal_logger(natwm_logger,LEVEL_ERROR,
                    "Received motion event when there isn\'t a currently grabbed client");
    nVar2 = INVALID_INPUT_ERROR;
  }
  else {
    nVar2 = NO_ERROR;
    if (client->is_fullscreen == false) {
      if ((mouse_mask >> 8 & 1) != 0) {
        nVar2 = client_handle_drag(state,client,x - pbVar1->start_x,y - pbVar1->start_y);
        return nVar2;
      }
      if (((mouse_mask >> 10 & 1) != 0) && (pbVar1->resize_helper != 0)) {
        xcb_configure_window_aux(state->xcb,pbVar1->resize_helper,0xc);
      }
    }
  }
  return nVar2;
}

Assistant:

enum natwm_error button_handle_motion(struct natwm_state *state, uint16_t mouse_mask, int16_t x,
                                      int16_t y)
{
        if (state->button_state->grabbed_client == NULL) {
                LOG_ERROR(natwm_logger,
                          "Received motion event when there isn't a currently grabbed client");

                return INVALID_INPUT_ERROR;
        }

        if (state->button_state->grabbed_client->is_fullscreen) {
                // Ignore full screen clients
                return NO_ERROR;
        }

        int16_t offset_x = (int16_t)(x - state->button_state->start_x);
        int16_t offset_y = (int16_t)(y - state->button_state->start_y);

        if (mouse_mask & XCB_BUTTON_MASK_1) {
                return client_handle_drag(
                        state, state->button_state->grabbed_client, offset_x, offset_y);
        }

        if (mouse_mask & XCB_BUTTON_MASK_3) {
                resize_helper(state, offset_x, offset_y);
        }

        return NO_ERROR;
}